

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O2

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementInstancerPools>::Initialize
          (ControlledLifetimeResource<Rml::ElementInstancerPools> *this)

{
  code *pcVar1;
  bool bVar2;
  ElementInstancerPools *this_00;
  
  if (this->pointer != (ElementInstancerPools *)0x0) {
    bVar2 = Assert("Resource already initialized.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x2e);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = (ElementInstancerPools *)operator_new(0x50);
  (this_00->pool_element).chunk_size = 0;
  (this_00->pool_element).grow = false;
  *(undefined3 *)&(this_00->pool_element).field_0x5 = 0;
  (this_00->pool_element).pool = (PoolChunk *)0x0;
  (this_00->pool_element).first_allocated_node = (PoolNode *)0x0;
  (this_00->pool_element).first_free_node = (PoolNode *)0x0;
  (this_00->pool_element).num_allocated_objects = 0;
  (this_00->pool_element).max_num_allocated_objects = 0;
  (this_00->pool_text_default).chunk_size = 0;
  (this_00->pool_text_default).grow = false;
  *(undefined3 *)&(this_00->pool_text_default).field_0x5 = 0;
  (this_00->pool_text_default).pool = (PoolChunk *)0x0;
  (this_00->pool_text_default).first_allocated_node = (PoolNode *)0x0;
  (this_00->pool_text_default).first_free_node = (PoolNode *)0x0;
  (this_00->pool_text_default).num_allocated_objects = 0;
  (this_00->pool_text_default).max_num_allocated_objects = 0;
  ElementInstancerPools::ElementInstancerPools(this_00);
  this->pointer = this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}